

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall mjs::parser::parse_postfix_expression(parser *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  wostream *pwVar5;
  socklen_t *in_RCX;
  wchar_t *extraout_RDX;
  wstring_view *s;
  pointer *__ptr;
  token_type *in_RSI;
  wchar_t *in_R9;
  wstring_view name;
  wstring_view message;
  token_type t;
  wostringstream _oss;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_1c8;
  pointer local_1b0;
  undefined1 local_1a8 [16];
  anon_union_32_3_e608ca2d_for_token_1 local_198 [11];
  
  parse_left_hand_side_expression((parser *)local_1e8);
  if ((char)in_RSI[0x1e] == line_terminator) {
LAB_00177069:
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1e8._0_8_;
  }
  else {
    local_1e8._12_4_ = in_RSI[0x20];
    accept((parser *)(local_1a8 + 0x10),(int)in_RSI,(sockaddr *)0x11,in_RCX);
    if (local_198[0]._0_4_ == 0x72) {
      accept((parser *)local_1d8,(int)in_RSI,(sockaddr *)0x12,in_RCX);
      uVar2 = local_1d8._0_4_;
      token::destroy((token *)local_1d8);
      token::destroy((token *)(local_1a8 + 0x10));
      if (uVar2 == 0x72) goto LAB_00177069;
    }
    else {
      token::destroy((token *)(local_1a8 + 0x10));
    }
    uVar1 = local_1e8._0_8_;
    if ((((char)in_RSI[0x18] == line_terminator) &&
        (iVar4 = (**(code **)(*(long *)local_1e8._0_8_ + 0x18))(local_1e8._0_8_), iVar4 == 0)) &&
       (name._M_str = extraout_RDX,
       name._M_len = *(size_t *)((long)&((wstring *)(uVar1 + 8))->field_2 + 8),
       bVar3 = is_strict_mode_unassignable_identifier
                         ((mjs *)(((wstring *)(uVar1 + 0x28))->_M_dataplus)._M_p,name), bVar3)) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)(local_1a8 + 0x10));
      pwVar5 = std::operator<<((wostream *)(local_1a8 + 0x10),"\"");
      local_1a8._0_8_ = *(uint64_t *)((long)&((wstring *)(local_1e8._0_8_ + 8))->field_2 + 8);
      local_1b0 = (((wstring *)(local_1e8._0_8_ + 0x28))->_M_dataplus)._M_p;
      cpp_quote_abi_cxx11_((wstring *)local_1d8,(mjs *)&local_1b0,s);
      pwVar5 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                         (pwVar5,(wchar_t *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                          local_1d8._8_8_);
      std::operator<<(pwVar5,"\" may not be modified in strict mode");
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_) != &local_1c8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
                         *)CONCAT44(local_1d8._4_4_,local_1d8._0_4_),
                        local_1c8._M_allocated_capacity * 4 + 4);
      }
      local_1b0 = *(pointer *)in_RSI;
      local_1a8._0_8_ = *(undefined8 *)(in_RSI + 2);
      if (local_1a8._0_8_ != whitespace) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_1a8._0_8_ + rshiftequal) = *(int *)(local_1a8._0_8_ + rshiftequal) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_1a8._0_8_ + rshiftequal) = *(int *)(local_1a8._0_8_ + rshiftequal) + 1;
        }
      }
      local_1a8._8_4_ = in_RSI[0x19];
      local_1a8._12_4_ = in_RSI[0xc];
      std::__cxx11::wstringbuf::str();
      message._M_len._4_4_ = local_1d8._4_4_;
      message._M_len._0_4_ = local_1d8._0_4_;
      message._M_str = in_R9;
      syntax_error((parser *)"parse_postfix_expression",(char *)0x229,(int)&local_1b0,
                   (source_extend *)local_1d8._8_8_,message);
    }
    make_expression<mjs::postfix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              (this,in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               (local_1e8 + 0xc));
    if ((element_type *)local_1e8._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_1e8._0_8_ + 8))();
    }
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_postfix_expression() {
        auto lhs = parse_left_hand_side_expression();
        // no line break before
        if (line_break_skipped_) {
            return lhs;
        }
        if (auto t = current_token_type(); accept(token_type::plusplus) || accept(token_type::minusminus)) {
            if (strict_mode_ && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be modified in strict mode");
            }
            return make_expression<postfix_expression>(t, std::move(lhs));
        }
        return lhs;
    }